

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

int __thiscall QtMWidgets::MessageBoxPrivate::init(MessageBoxPrivate *this,EVP_PKEY_CTX *ctx)

{
  MessageBox *pMVar1;
  int iVar2;
  QVBoxLayout *pQVar3;
  QFrame *pQVar4;
  MsgBoxTitle *this_00;
  ScrollArea *this_01;
  TextLabel *pTVar5;
  QPalette *this_02;
  QColor *c;
  QHBoxLayout *this_03;
  MsgBoxButton *this_04;
  QString *in_RDX;
  QArrayDataPointer<char16_t> local_48;
  ButtonRole local_2c;
  
  QDialog::setModal(SUB81(this->q,0));
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3,(QWidget *)this->q);
  QLayout::setContentsMargins((int)pQVar3,0,0,0);
  pQVar4 = (QFrame *)operator_new(0x28);
  QFrame::QFrame(pQVar4,this->q,0);
  this->frame = pQVar4;
  QFrame::setFrameStyle((int)pQVar4);
  QBoxLayout::addWidget(pQVar3,this->frame,0,0);
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3,(QWidget *)this->frame);
  this->vbox = pQVar3;
  (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,0);
  QLayout::setContentsMargins((int)this->vbox,3,3,3);
  this_00 = (MsgBoxTitle *)operator_new(0x30);
  MsgBoxTitle::MsgBoxTitle(this_00,(QString *)ctx,(QWidget *)this->frame);
  this->title = this_00;
  QBoxLayout::addWidget(this->vbox,this_00,0);
  pQVar4 = (QFrame *)operator_new(0x28);
  QFrame::QFrame(pQVar4,this->frame,0);
  this->h1 = pQVar4;
  QFrame::setFrameStyle((int)pQVar4);
  QBoxLayout::addWidget(this->vbox,this->h1,0);
  this_01 = (ScrollArea *)operator_new(0x30);
  ScrollArea::ScrollArea(this_01,(QWidget *)this->frame);
  this->scrollArea = this_01;
  ScrollArea::setWidgetResizable(this_01,true);
  pTVar5 = (TextLabel *)operator_new(0x30);
  TextLabel::TextLabel(pTVar5,(QWidget *)this->frame,(WindowFlags)0x0);
  this->textLabel = pTVar5;
  QWidget::setBackgroundRole((ColorRole)pTVar5);
  pTVar5 = this->textLabel;
  this_02 = (QPalette *)QWidget::palette();
  c = QPalette::color(this_02,WindowText);
  TextLabel::setColor(pTVar5,c);
  QWidget::setAutoFillBackground(SUB81(this->textLabel,0));
  TextLabel::setText(this->textLabel,in_RDX);
  ScrollArea::setWidget(this->scrollArea,(QWidget *)this->textLabel);
  QBoxLayout::addWidget(this->vbox,this->scrollArea,0);
  pQVar4 = (QFrame *)operator_new(0x28);
  QFrame::QFrame(pQVar4,this->frame,0);
  this->h2 = pQVar4;
  QFrame::setFrameStyle((int)pQVar4);
  QBoxLayout::addWidget(this->vbox,this->h2,0);
  this_03 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_03);
  this->hbox = this_03;
  (**(code **)(*(long *)this_03 + 0x68))(this_03);
  QLayout::setContentsMargins((int)this->hbox,0,0,0);
  this_04 = (MsgBoxButton *)operator_new(0x30);
  QObject::tr((QString *)&local_48,"OK",(char *)0x0,-1);
  MsgBoxButton::MsgBoxButton(this_04,(QString *)&local_48,(QWidget *)this->frame);
  this->okButton = this_04;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  local_48.d = (Data *)this->okButton;
  local_2c = AcceptRole;
  QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::insert
            (&this->buttonsMap,(QAbstractButton **)&local_48,&local_2c);
  QList<QAbstractButton_*>::append(&this->buttons,&this->okButton->super_QAbstractButton);
  QBoxLayout::addWidget(this->hbox,this->okButton,0,0);
  QBoxLayout::addLayout((QLayout *)this->vbox,(int)this->hbox);
  pMVar1 = this->q;
  local_48.d = (Data *)(**(code **)(*(long *)this->vbox + 0xf0))();
  iVar2 = QWidget::resize((QSize *)pMVar1);
  return iVar2;
}

Assistant:

void
MessageBoxPrivate::init( const QString & titl, const QString & txt )
{
	q->setModal( true );

	QVBoxLayout * layout = new QVBoxLayout( q );
	layout->setContentsMargins( 0, 0, 0, 0 );

	frame = new QFrame( q );
	frame->setFrameStyle( QFrame::Box | QFrame::Plain );
	layout->addWidget( frame );

	vbox = new QVBoxLayout( frame );
	vbox->setSpacing( 0 );
	vbox->setContentsMargins( 3, 3, 3, 3 );

	title = new MsgBoxTitle( titl, frame );
	vbox->addWidget( title );

	h1 = new QFrame( frame );
	h1->setFrameStyle( QFrame::HLine | QFrame::Sunken );
	vbox->addWidget( h1 );

	scrollArea = new ScrollArea( frame );
	scrollArea->setWidgetResizable( true );

	textLabel = new TextLabel( frame );
	textLabel->setBackgroundRole( QPalette::Window );
    textLabel->setColor( q->palette().color( QPalette::WindowText ) );
	textLabel->setAutoFillBackground( true );
	textLabel->setText( txt );
	scrollArea->setWidget( textLabel );

	vbox->addWidget( scrollArea );

	h2 = new QFrame( frame );
	h2->setFrameStyle( QFrame::HLine | QFrame::Sunken );
	vbox->addWidget( h2 );

	hbox = new QHBoxLayout;
	hbox->setSpacing( 0 );
	hbox->setContentsMargins( 0, 0, 0, 0 );

	okButton = new MsgBoxButton( QObject::tr( "OK" ), frame );
	buttonsMap.insert( okButton, MessageBox::AcceptRole );
	buttons.append( okButton );
	hbox->addWidget( okButton );

	vbox->addLayout( hbox );

	q->resize( vbox->sizeHint() );
}